

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall cmFileCopier::InstallSymlink(cmFileCopier *this,char *fromFile,char *toFile)

{
  cmCommand *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  __type _Var4;
  ostream *poVar5;
  string local_450;
  undefined1 local_430 [8];
  ostringstream e_1;
  allocator local_2b1;
  string local_2b0;
  allocator local_289;
  string local_288;
  allocator local_261;
  string local_260;
  undefined1 local_240 [8];
  string oldSymlinkTarget;
  undefined1 local_218 [3];
  bool copy;
  undefined1 local_1f8 [8];
  ostringstream e;
  allocator local_69;
  string local_68;
  undefined1 local_48 [8];
  string symlinkTarget;
  char *toFile_local;
  char *fromFile_local;
  cmFileCopier *this_local;
  
  symlinkTarget.field_2._8_8_ = toFile;
  std::__cxx11::string::string((string *)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,fromFile,&local_69);
  bVar3 = cmsys::SystemTools::ReadSymlink(&local_68,(string *)local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    oldSymlinkTarget.field_2._M_local_buf[0xb] = '\x01';
    if ((this->Always & 1U) == 0) {
      std::__cxx11::string::string((string *)local_240);
      uVar2 = symlinkTarget.field_2._8_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_260,(char *)uVar2,&local_261);
      bVar3 = cmsys::SystemTools::ReadSymlink(&local_260,(string *)local_240);
      std::__cxx11::string::~string((string *)&local_260);
      std::allocator<char>::~allocator((allocator<char> *)&local_261);
      if ((bVar3) &&
         (_Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_48,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_240), _Var4)) {
        oldSymlinkTarget.field_2._M_local_buf[0xb] = '\0';
      }
      std::__cxx11::string::~string((string *)local_240);
    }
    (*this->_vptr_cmFileCopier[4])
              (this,symlinkTarget.field_2._8_8_,2,
               (ulong)((byte)oldSymlinkTarget.field_2._M_local_buf[0xb] & 1));
    uVar2 = symlinkTarget.field_2._8_8_;
    if ((oldSymlinkTarget.field_2._M_local_buf[0xb] & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_288,(char *)uVar2,&local_289);
      cmsys::SystemTools::RemoveFile(&local_288);
      std::__cxx11::string::~string((string *)&local_288);
      std::allocator<char>::~allocator((allocator<char> *)&local_289);
      uVar2 = symlinkTarget.field_2._8_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2b0,(char *)uVar2,&local_2b1);
      bVar3 = cmsys::SystemTools::CreateSymlink((string *)local_48,&local_2b0);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_430);
        poVar5 = std::operator<<((ostream *)local_430,this->Name);
        poVar5 = std::operator<<(poVar5," cannot duplicate symlink \"");
        poVar5 = std::operator<<(poVar5,fromFile);
        poVar5 = std::operator<<(poVar5,"\" at \"");
        poVar5 = std::operator<<(poVar5,(char *)symlinkTarget.field_2._8_8_);
        std::operator<<(poVar5,"\".");
        pcVar1 = &this->FileCommand->super_cmCommand;
        std::__cxx11::ostringstream::str();
        cmCommand::SetError(pcVar1,&local_450);
        std::__cxx11::string::~string((string *)&local_450);
        this_local._7_1_ = false;
        oldSymlinkTarget.field_2._12_4_ = 1;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_430);
        goto LAB_0072ff39;
      }
    }
    this_local._7_1_ = true;
    oldSymlinkTarget.field_2._12_4_ = 1;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    poVar5 = std::operator<<((ostream *)local_1f8,this->Name);
    poVar5 = std::operator<<(poVar5," cannot read symlink \"");
    poVar5 = std::operator<<(poVar5,fromFile);
    poVar5 = std::operator<<(poVar5,"\" to duplicate at \"");
    poVar5 = std::operator<<(poVar5,(char *)symlinkTarget.field_2._8_8_);
    std::operator<<(poVar5,"\".");
    pcVar1 = &this->FileCommand->super_cmCommand;
    std::__cxx11::ostringstream::str();
    cmCommand::SetError(pcVar1,(string *)local_218);
    std::__cxx11::string::~string((string *)local_218);
    this_local._7_1_ = false;
    oldSymlinkTarget.field_2._12_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
  }
LAB_0072ff39:
  std::__cxx11::string::~string((string *)local_48);
  return this_local._7_1_;
}

Assistant:

bool cmFileCopier::InstallSymlink(const char* fromFile, const char* toFile)
{
  // Read the original symlink.
  std::string symlinkTarget;
  if(!cmSystemTools::ReadSymlink(fromFile, symlinkTarget))
    {
    std::ostringstream e;
    e << this->Name << " cannot read symlink \"" << fromFile
      << "\" to duplicate at \"" << toFile << "\".";
    this->FileCommand->SetError(e.str());
    return false;
    }

  // Compare the symlink value to that at the destination if not
  // always installing.
  bool copy = true;
  if(!this->Always)
    {
    std::string oldSymlinkTarget;
    if(cmSystemTools::ReadSymlink(toFile, oldSymlinkTarget))
      {
      if(symlinkTarget == oldSymlinkTarget)
        {
        copy = false;
        }
      }
    }

  // Inform the user about this file installation.
  this->ReportCopy(toFile, TypeLink, copy);

  if(copy)
    {
    // Remove the destination file so we can always create the symlink.
    cmSystemTools::RemoveFile(toFile);

    // Create the symlink.
    if(!cmSystemTools::CreateSymlink(symlinkTarget, toFile))
      {
      std::ostringstream e;
      e << this->Name <<  " cannot duplicate symlink \"" << fromFile
        << "\" at \"" << toFile << "\".";
      this->FileCommand->SetError(e.str());
      return false;
      }
    }

  return true;
}